

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_io.c
# Opt level: O3

size_t Qiniu_Crc32_Fwrite(void *buf,size_t cbelem,size_t n,Qiniu_Crc32 *self)

{
  ulong uVar1;
  size_t sVar2;
  
  uVar1 = self->val;
  if (n != 0) {
    uVar1 = uVar1 ^ 0xffffffff;
    sVar2 = 0;
    do {
      uVar1 = uVar1 >> 8 ^ crcTable[(byte)((byte)uVar1 ^ *(byte *)((long)buf + sVar2))];
      sVar2 = sVar2 + 1;
    } while (n != sVar2);
    uVar1 = uVar1 ^ 0xffffffff;
  }
  self->val = uVar1;
  return n;
}

Assistant:

static size_t Qiniu_Crc32_Fwrite(const void *buf, size_t cbelem, size_t n, Qiniu_Crc32 *self)
{
	self->val = Qiniu_Crc32_Update(self->val, buf, n);
	return n;
}